

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

void av1_make_default_subpel_ms_params
               (SUBPEL_MOTION_SEARCH_PARAMS *ms_params,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,
               MV *ref_mv,int *cost_list)

{
  short sVar1;
  short sVar2;
  MvCosts *pMVar3;
  int32_t *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  ms_params->allow_hp = (uint)(cpi->common).features.allow_high_precision_mv;
  ms_params->forced_stop = (cpi->sf).mv_sf.subpel_force_stop;
  ms_params->iters_per_step = (cpi->sf).mv_sf.subpel_iters_per_step;
  if ((cpi->sf).mv_sf.subpel_search_method == '\0') {
    cost_list = (int *)0x0;
  }
  else if ((cpi->sf).mv_sf.use_fullpel_costlist == 0) {
    cost_list = (int *)0x0;
  }
  ms_params->cost_list = cost_list;
  iVar7 = (x->mv_limits).col_min * 8;
  sVar1 = ref_mv->col;
  iVar5 = (int)sVar1;
  if (iVar7 <= iVar5 + -0x1ff8) {
    iVar7 = iVar5 + -0x1ff8;
  }
  iVar6 = (x->mv_limits).col_max * 8;
  if (iVar5 + 0x1ff8 <= iVar6) {
    iVar6 = iVar5 + 0x1ff8;
  }
  iVar12 = (x->mv_limits).row_min * 8;
  sVar2 = ref_mv->row;
  iVar8 = (int)sVar2;
  iVar9 = iVar8 + -0x1ff8;
  if (iVar8 + -0x1ff8 < iVar12) {
    iVar9 = iVar12;
  }
  iVar13 = (x->mv_limits).row_max * 8;
  iVar12 = iVar8 + 0x1ff8;
  if (iVar13 < iVar8 + 0x1ff8) {
    iVar12 = iVar13;
  }
  if (iVar6 < iVar7) {
    iVar6 = iVar7;
  }
  if (iVar12 < iVar9) {
    iVar12 = iVar9;
  }
  if (iVar7 < -0x3ffe) {
    iVar7 = -0x3fff;
  }
  (ms_params->mv_limits).col_min = iVar7;
  if (0x3ffe < iVar6) {
    iVar6 = 0x3fff;
  }
  (ms_params->mv_limits).col_max = iVar6;
  if (iVar9 < -0x3ffe) {
    iVar9 = -0x3fff;
  }
  (ms_params->mv_limits).row_min = iVar9;
  if (0x3ffe < iVar12) {
    iVar12 = 0x3fff;
  }
  (ms_params->mv_limits).row_max = iVar12;
  if ((cpi->oxcf).algo_cfg.sharpness == 3) {
    iVar6 = (x->e_mbd).mi_row;
    iVar9 = (x->e_mbd).mi_col;
    iVar11 = (cpi->common).height * 8 +
             ((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [bsize] + iVar6) * -0x20 + 0x40;
    iVar10 = (cpi->common).width * 8 +
             ((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [bsize] + iVar9) * -0x20 + 0x40;
    iVar12 = (ms_params->mv_limits).col_max;
    iVar13 = (ms_params->mv_limits).row_min;
    iVar6 = iVar6 * -0x20 + -0x40;
    if (iVar6 < iVar13) {
      iVar6 = iVar13;
    }
    (ms_params->mv_limits).row_min = iVar6;
    iVar6 = (ms_params->mv_limits).row_max;
    if (iVar6 < iVar11) {
      iVar11 = iVar6;
    }
    (ms_params->mv_limits).row_max = iVar11;
    iVar6 = iVar9 * -0x20 + -0x40;
    if (iVar6 < iVar7) {
      iVar6 = iVar7;
    }
    (ms_params->mv_limits).col_min = iVar6;
    if (iVar12 < iVar10) {
      iVar10 = iVar12;
    }
    (ms_params->mv_limits).col_max = iVar10;
  }
  pMVar3 = x->mv_costs;
  (ms_params->mv_cost_params).ref_mv = ref_mv;
  (ms_params->mv_cost_params).mv_cost_type = '\0';
  iVar7 = x->errorperbit;
  iVar6 = x->sadperbit;
  (ms_params->mv_cost_params).full_ref_mv =
       (FULLPEL_MV)
       ((uint)(-1 < sVar2) + iVar8 + 3 >> 3 & 0xffff |
       ((uint)(-1 < sVar1) + iVar5) * 0x2000 + 0x6000 & 0xffff0000);
  (ms_params->mv_cost_params).error_per_bit = iVar7;
  (ms_params->mv_cost_params).sad_per_bit = iVar6;
  if (pMVar3 != (MvCosts *)0x0) {
    (ms_params->mv_cost_params).mvjcost = pMVar3->nmv_joint_cost;
    (ms_params->mv_cost_params).mvcost[0] = *pMVar3->mv_cost_stack;
    (ms_params->mv_cost_params).mvcost[1] = pMVar3->mv_cost_stack[1];
  }
  (ms_params->var_params).vfp = cpi->ppi->fn_ptr + bsize;
  (ms_params->var_params).subpel_search_type = (cpi->sf).mv_sf.use_accurate_subpel_search;
  (ms_params->var_params).w = (uint)block_size_wide[bsize];
  (ms_params->var_params).h = (uint)block_size_high[bsize];
  (ms_params->var_params).ms_buffers.ref = (x->e_mbd).plane[0].pre;
  (ms_params->var_params).ms_buffers.src = &x->plane[0].src;
  (ms_params->var_params).ms_buffers.second_pred = (uint8_t *)0x0;
  (ms_params->var_params).ms_buffers.mask = (uint8_t *)0x0;
  (ms_params->var_params).ms_buffers.mask_stride = 0;
  (ms_params->var_params).ms_buffers.inv_mask = 0;
  piVar4 = (x->obmc_buffer).mask;
  (ms_params->var_params).ms_buffers.wsrc = (x->obmc_buffer).wsrc;
  (ms_params->var_params).ms_buffers.obmc_mask = piVar4;
  return;
}

Assistant:

void av1_make_default_subpel_ms_params(SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                                       const struct AV1_COMP *cpi,
                                       const MACROBLOCK *x, BLOCK_SIZE bsize,
                                       const MV *ref_mv, const int *cost_list) {
  const AV1_COMMON *cm = &cpi->common;
  // High level params
  ms_params->allow_hp = cm->features.allow_high_precision_mv;
  ms_params->forced_stop = cpi->sf.mv_sf.subpel_force_stop;
  ms_params->iters_per_step = cpi->sf.mv_sf.subpel_iters_per_step;
  ms_params->cost_list = cond_cost_list_const(cpi, cost_list);

  av1_set_subpel_mv_search_range(&ms_params->mv_limits, &x->mv_limits, ref_mv);

  if (cpi->oxcf.algo_cfg.sharpness == 3) {
    int top_margin = GET_MV_SUBPEL(x->e_mbd.mi_row * MI_SIZE + 8);
    int left_margin = GET_MV_SUBPEL(x->e_mbd.mi_col * MI_SIZE + 8);
    int bottom_margin =
        GET_MV_SUBPEL(cpi->common.height - mi_size_high[bsize] * MI_SIZE -
                      x->e_mbd.mi_row * MI_SIZE + 8);
    int right_margin =
        GET_MV_SUBPEL(cpi->common.width - mi_size_wide[bsize] * MI_SIZE -
                      x->e_mbd.mi_col * MI_SIZE + 8);
    SubpelMvLimits *mv_limits = &ms_params->mv_limits;
    mv_limits->row_min = AOMMAX(mv_limits->row_min, -top_margin);
    mv_limits->row_max = AOMMIN(mv_limits->row_max, bottom_margin);
    mv_limits->col_min = AOMMAX(mv_limits->col_min, -left_margin);
    mv_limits->col_max = AOMMIN(mv_limits->col_max, right_margin);
  }

  // Mvcost params
  init_mv_cost_params(&ms_params->mv_cost_params, x->mv_costs, ref_mv,
                      x->errorperbit, x->sadperbit);

  // Subpel variance params
  ms_params->var_params.vfp = &cpi->ppi->fn_ptr[bsize];
  ms_params->var_params.subpel_search_type =
      cpi->sf.mv_sf.use_accurate_subpel_search;
  ms_params->var_params.w = block_size_wide[bsize];
  ms_params->var_params.h = block_size_high[bsize];

  // Ref and src buffers
  MSBuffers *ms_buffers = &ms_params->var_params.ms_buffers;
  init_ms_buffers(ms_buffers, x);
}